

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>::
insert<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Entry,capnp::EnumSchema&>
          (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
                 table,size_t pos,EnumSchema *params)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  HashBucket *pHVar8;
  uint hash;
  HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Callbacks>
  *this_00;
  ulong targetSize;
  uint64_t *in_R9;
  size_t sVar9;
  HashBucket *s;
  HashBucket *pHVar10;
  Maybe<unsigned_long> MVar11;
  Type local_40;
  
  this_00 = (HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Callbacks>
             *)table.ptr;
  sVar9 = (this_00->buckets).size_;
  uVar2 = sVar9 * 2;
  if (uVar2 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar2) {
      targetSize = uVar2;
    }
    HashIndex<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Callbacks>
    ::rehash(this_00,targetSize);
    sVar9 = (this_00->buckets).size_;
  }
  iVar4 = (int)(*in_R9 >> 0x20) * 0xbfe3;
  iVar6 = -(int)*in_R9;
  hash = (uint)(iVar4 != iVar6);
  uVar5 = kj::_::chooseBucket(hash,(uint)sVar9);
  pHVar10 = (HashBucket *)0x0;
  aVar7 = extraout_RDX;
  do {
    pHVar8 = (this_00->buckets).ptr + uVar5;
    uVar1 = pHVar8->value;
    if (uVar1 == 1) {
      if (pHVar10 == (HashBucket *)0x0) {
        pHVar10 = pHVar8;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar10 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar8 = pHVar10;
        }
        *pHVar8 = (HashBucket)(((ulong)(iVar4 != iVar6) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
                 )0x0;
        goto LAB_001f32a0;
      }
      if (pHVar8->hash == hash) {
        local_40.field_4.scopeId = *in_R9;
        local_40.baseType = ENUM;
        local_40.listDepth = '\0';
        bVar3 = capnp::Type::operator==((Type *)((ulong)(uVar1 - 2) * 0x20 + table.size_),&local_40)
        ;
        aVar7 = extraout_RDX_00;
        if (bVar3) {
          uVar1 = pHVar8->value;
          *this = (HashIndex<kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_001f32a0:
          MVar11.ptr.field_1.value = aVar7.value;
          MVar11.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar11.ptr;
        }
      }
    }
    sVar9 = (ulong)uVar5 + 1;
    uVar5 = 0;
    if (sVar9 != (this_00->buckets).size_) {
      uVar5 = (uint)sVar9;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }